

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void list_store_send(t_list_store *x,t_symbol *s)

{
  t_alist *y_00;
  int count;
  t_pd *pp_Var1;
  t_atom *to;
  t_symbol *ptVar2;
  long lVar3;
  t_atom *ptVar4;
  undefined1 auStack_48 [16];
  t_alist y;
  
  ptVar4 = (t_atom *)auStack_48;
  if (s->s_thing != (_class **)0x0) {
    count = (x->x_alist).l_n;
    lVar3 = (long)count;
    if (count < 100) {
      ptVar4 = (t_atom *)(auStack_48 + lVar3 * -0x10);
      to = ptVar4;
    }
    else {
      to = (t_atom *)getbytes(lVar3 << 4);
    }
    if ((x->x_alist).l_npointer == 0) {
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd53;
      alist_toatoms(&x->x_alist,to,0,count);
      pp_Var1 = s->s_thing;
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd63;
      ptVar2 = gensym("list");
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd73;
      pd_list(pp_Var1,ptVar2,count,to);
    }
    else {
      y_00 = (t_alist *)(auStack_48 + 8);
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd0e;
      alist_clone(&x->x_alist,y_00,0,count);
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd1d;
      alist_toatoms(y_00,to,0,count);
      pp_Var1 = s->s_thing;
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd2d;
      ptVar2 = gensym("list");
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd3d;
      pd_list(pp_Var1,ptVar2,count,to);
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd45;
      alist_clear(y_00);
    }
    if (99 < count) {
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x17cd87;
      freebytes(to,lVar3 << 4);
    }
    return;
  }
  pd_error(x,"%s: no such object",s->s_name);
  return;
}

Assistant:

static void list_store_send(t_list_store *x, t_symbol *s)
{
    t_atom *vec;
    int n = x->x_alist.l_n;
    if (!s->s_thing)
    {
        pd_error(x, "%s: no such object", s->s_name);
        return;
    }
    ATOMS_ALLOCA(vec, n);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, 0, n);
        alist_toatoms(&y, vec, 0, n);
        pd_list(s->s_thing, gensym("list"), n, vec);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, vec, 0, n);
        pd_list(s->s_thing, gensym("list"), n, vec);
    }
    ATOMS_FREEA(vec, n);
}